

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

Rule * __thiscall EOPlus::Context::GetGoal(Context *this)

{
  State *pSVar1;
  reference pRVar2;
  
  pSVar1 = this->state;
  if ((pSVar1 != (State *)0x0) &&
     ((pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur)) {
    pRVar2 = std::_Deque_iterator<EOPlus::Rule,_EOPlus::Rule_&,_EOPlus::Rule_*>::operator[]
                       (&(pSVar1->rules).
                         super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
                         super__Deque_impl_data._M_start,pSVar1->goal_rule);
    return pRVar2;
  }
  return (Rule *)0x0;
}

Assistant:

const Rule* Context::GetGoal() const
	{
		if (!this->state || this->state->rules.empty())
			return 0;

		return &this->state->rules[this->state->goal_rule];
	}